

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall testing::internal::FunctionMocker<bool_()>::Invoke(FunctionMocker<bool_()> *this)

{
  bool bVar1;
  UntypedActionResultHolderBase *f;
  ActionResultHolder<bool> *__p;
  pointer this_00;
  unique_ptr<testing::internal::ActionResultHolder<bool>,_std::default_delete<testing::internal::ActionResultHolder<bool>_>_>
  local_20;
  unique_ptr<testing::internal::ActionResultHolder<bool>,_std::default_delete<testing::internal::ActionResultHolder<bool>_>_>
  holder;
  ArgumentTuple tuple;
  FunctionMocker<bool_()> *this_local;
  
  holder._M_t.
  super___uniq_ptr_impl<testing::internal::ActionResultHolder<bool>,_std::default_delete<testing::internal::ActionResultHolder<bool>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<bool>_*,_std::default_delete<testing::internal::ActionResultHolder<bool>_>_>
  .super__Head_base<0UL,_testing::internal::ActionResultHolder<bool>_*,_false>._M_head_impl._7_1_ =
       0;
  f = UntypedFunctionMockerBase::UntypedInvokeWith
                (&this->super_UntypedFunctionMockerBase,
                 (void *)((long)&holder._M_t.
                                 super___uniq_ptr_impl<testing::internal::ActionResultHolder<bool>,_std::default_delete<testing::internal::ActionResultHolder<bool>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<bool>_*,_std::default_delete<testing::internal::ActionResultHolder<bool>_>_>
                                 .
                                 super__Head_base<0UL,_testing::internal::ActionResultHolder<bool>_*,_false>
                                 ._M_head_impl + 7));
  __p = DownCast_<testing::internal::ActionResultHolder<bool>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<bool>,std::default_delete<testing::internal::ActionResultHolder<bool>>>
  ::unique_ptr<std::default_delete<testing::internal::ActionResultHolder<bool>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<bool>,std::default_delete<testing::internal::ActionResultHolder<bool>>>
              *)&local_20,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<bool>,_std::default_delete<testing::internal::ActionResultHolder<bool>_>_>
            ::operator->(&local_20);
  bVar1 = ActionResultHolder<bool>::Unwrap(this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<bool>,_std::default_delete<testing::internal::ActionResultHolder<bool>_>_>
  ::~unique_ptr(&local_20);
  return bVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }